

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O3

int Cbs2_ManDeriveReason(Cbs2_Man_t *p,int Level)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  int *piVar7;
  int *piVar8;
  int iVar9;
  Vec_Int_t *pVVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  size_t __size;
  long lVar14;
  ulong uVar15;
  int *piVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  
  piVar8 = (p->pClauses).pData;
  lVar14 = (long)(p->pClauses).iHead;
  if (piVar8[lVar14] != 0) {
    __assert_fail("pQue->pData[pQue->iHead] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x2d4,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
  }
  if (piVar8[lVar14 + 1] != 0) {
    __assert_fail("pQue->pData[pQue->iHead+1] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x2d5,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
  }
  uVar15 = lVar14 + 2;
  if ((p->pClauses).iTail <= (int)uVar15) {
    __assert_fail("pQue->iHead + 2 < pQue->iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x2d6,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
  }
  p->vTemp->nSize = 0;
  uVar19 = uVar15 & 0xffffffff;
  do {
    uVar2 = piVar8[uVar15];
    uVar18 = (ulong)uVar2;
    if (((int)uVar2 < 0) || ((p->vMark).nSize <= (int)uVar2)) goto LAB_00722ec1;
    pcVar4 = (p->vMark).pArray;
    if (pcVar4[uVar18] == '\0') {
      pcVar4[uVar18] = '\x01';
      Vec_IntPush(p->vTemp,uVar2);
      uVar3 = (p->vLevReason).nSize;
      if ((int)uVar3 <= (int)(uVar2 * 3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar16 = (p->vLevReason).pArray;
      iVar9 = piVar16[uVar18 * 3];
      if (iVar9 == -1) {
        __assert_fail("!Cbs2_VarUnused(p, iVar)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                      ,0x8f,"int Cbs2_VarDecLevel(Cbs2_Man_t *, int)");
      }
      iVar11 = (int)uVar19;
      if (iVar9 < Level) {
        piVar8 = (p->pClauses).pData;
        uVar19 = (ulong)(iVar11 + 1);
        piVar8[iVar11] = uVar2;
      }
      else {
        if (iVar9 != Level) {
          __assert_fail("iLitLevel == Level",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                        ,0x2ed,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
        }
        uVar5 = uVar2 * 3 + 1;
        if (uVar3 <= uVar5) goto LAB_00722f5c;
        iVar9 = piVar16[uVar5];
        if (iVar9 == 0) {
          piVar8 = (p->pClauses).pData;
          if ((long)piVar16[(ulong)uVar5 + 1] == 0) {
            lVar14 = (long)(p->pClauses).iHead;
            if (piVar8[lVar14 + 1] != 0) {
              __assert_fail("pQue->pData[pQue->iHead+1] == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                            ,0x2f1,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
            }
            piVar8[lVar14 + 1] = uVar2;
          }
          else {
            uVar3 = piVar8[piVar16[(ulong)uVar5 + 1]];
            iVar11 = (p->pClauses).iTail + uVar3;
            iVar9 = (p->pClauses).nSize;
            piVar7 = piVar8;
            if (iVar9 < iVar11) {
              (p->pClauses).nSize = iVar9 * 2;
              piVar7 = (int *)realloc(piVar8,(long)iVar9 << 3);
              iVar9 = (p->pClauses).nSize;
              iVar11 = (p->pClauses).iTail + uVar3;
              (p->pClauses).pData = piVar7;
            }
            if (iVar9 < iVar11) {
              __assert_fail("p->iTail + Plus <= p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                            ,0x180,"void Cbs2_QueGrow(Cbs2_Que_t *, int)");
            }
            iVar9 = piVar16[(ulong)uVar5 + 1];
            if (piVar7[(long)iVar9 + 1] < 0) {
LAB_00722eff:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            if (uVar2 != (uint)piVar7[(long)iVar9 + 1] >> 1) {
              __assert_fail("iObj == Abc_Lit2Var(pLits[0])",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                            ,0x300,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
            }
            piVar8 = piVar7;
            if (1 < (int)uVar3) {
              lVar14 = 0;
              do {
                uVar2 = piVar7[(long)iVar9 + lVar14 + 2];
                if ((int)uVar2 < 0) goto LAB_00722eff;
                iVar11 = (p->pClauses).iTail;
                if (iVar11 == (p->pClauses).nSize) {
                  (p->pClauses).nSize = iVar11 * 2;
                  piVar8 = (p->pClauses).pData;
                  if (piVar8 == (int *)0x0) {
                    piVar8 = (int *)malloc((long)iVar11 << 3);
                  }
                  else {
                    piVar8 = (int *)realloc(piVar8,(long)iVar11 << 3);
                    iVar11 = (p->pClauses).iTail;
                  }
                  (p->pClauses).pData = piVar8;
                }
                else {
                  piVar8 = (p->pClauses).pData;
                }
                (p->pClauses).iTail = iVar11 + 1;
                piVar8[iVar11] = uVar2 >> 1;
                lVar14 = lVar14 + 1;
              } while ((ulong)uVar3 - 1 != lVar14);
            }
          }
        }
        else {
          iVar11 = (p->pClauses).iTail;
          if (iVar11 == (p->pClauses).nSize) {
            (p->pClauses).nSize = iVar11 * 2;
            piVar8 = (p->pClauses).pData;
            if (piVar8 == (int *)0x0) {
              piVar8 = (int *)malloc((long)iVar11 << 3);
            }
            else {
              piVar8 = (int *)realloc(piVar8,(long)iVar11 << 3);
              iVar11 = (p->pClauses).iTail;
            }
            (p->pClauses).pData = piVar8;
          }
          else {
            piVar8 = (p->pClauses).pData;
          }
          (p->pClauses).iTail = iVar11 + 1;
          piVar8[iVar11] = iVar9;
          iVar9 = piVar16[(ulong)uVar5 + 1];
          if (iVar9 != 0) {
            iVar11 = (p->pClauses).iTail;
            if (iVar11 == (p->pClauses).nSize) {
              (p->pClauses).nSize = iVar11 * 2;
              piVar8 = (int *)realloc(piVar8,(long)iVar11 << 3);
              iVar11 = (p->pClauses).iTail;
              (p->pClauses).pData = piVar8;
            }
            (p->pClauses).iTail = iVar11 + 1;
            piVar8[iVar11] = iVar9;
          }
        }
      }
    }
    iVar9 = (int)uVar19;
    uVar15 = uVar15 + 1;
  } while ((long)uVar15 < (long)(p->pClauses).iTail);
  uVar2 = (p->pClauses).iHead;
  piVar8 = (p->pClauses).pData;
  if (piVar8[(int)uVar2] != 0) {
    __assert_fail("pQue->pData[pQue->iHead] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x305,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
  }
  if (piVar8[(long)(int)uVar2 + 1] == 0) {
    __assert_fail("pQue->pData[pQue->iHead+1] != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x306,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
  }
  (p->pClauses).iTail = iVar9;
  pVVar10 = p->vTemp;
  if (0 < pVVar10->nSize) {
    lVar14 = 0;
    do {
      iVar9 = pVVar10->pArray[lVar14];
      if (((long)iVar9 < 0) || ((p->vMark).nSize <= iVar9)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
      }
      (p->vMark).pArray[iVar9] = '\0';
      lVar14 = lVar14 + 1;
      pVVar10 = p->vTemp;
    } while (lVar14 < pVVar10->nSize);
    uVar2 = (p->pClauses).iHead;
    iVar9 = (p->pClauses).iTail;
  }
  if (iVar9 <= (int)(uVar2 + 1)) {
    __assert_fail("pQue->iHead+1 < pQue->iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x2ab,"int Cbs2_QueFinish(Cbs2_Man_t *, int)");
  }
  piVar8 = (p->pClauses).pData;
  lVar14 = (long)(int)uVar2;
  piVar8[lVar14] = iVar9 + ~uVar2;
  uVar3 = (p->pClauses).iTail;
  (p->pClauses).iHead = uVar3;
  if (iVar9 + ~uVar2 == 1) {
    return uVar2;
  }
  lVar12 = (long)(int)uVar3;
  (p->pClauses).iHead = uVar2;
  uVar5 = uVar3;
  if ((int)uVar2 < (int)uVar3) {
    lVar13 = 0;
    uVar15 = (ulong)uVar3;
    do {
      uVar5 = (uint)uVar15;
      uVar17 = piVar8[lVar14];
      if (((ulong)uVar17 == 0) || (lVar12 == lVar14)) break;
      if (lVar13 != 0) {
        if (((int)uVar17 < 0) || ((p->vAssign).nSize <= (int)uVar17)) {
LAB_00722ec1:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
        bVar1 = (p->vAssign).pArray[uVar17];
        if (1 < bVar1) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        uVar17 = (uint)bVar1 + uVar17 * 2;
      }
      if (uVar5 == (p->pClauses).nSize) {
        (p->pClauses).nSize = uVar5 * 2;
        piVar8 = (p->pClauses).pData;
        __size = (long)(int)(uVar5 * 2) << 2;
        if (piVar8 == (int *)0x0) {
          piVar8 = (int *)malloc(__size);
        }
        else {
          piVar8 = (int *)realloc(piVar8,__size);
          uVar5 = (p->pClauses).iTail;
        }
        (p->pClauses).pData = piVar8;
      }
      else {
        piVar8 = (p->pClauses).pData;
      }
      (p->pClauses).iTail = uVar5 + 1;
      piVar8[(int)uVar5] = uVar17;
      lVar14 = lVar14 + 1;
      uVar5 = (p->pClauses).iTail;
      uVar15 = (ulong)(int)uVar5;
      lVar13 = lVar13 + -4;
    } while (lVar14 < (long)uVar15);
  }
  if (uVar5 == (p->pClauses).nSize) {
    (p->pClauses).nSize = uVar5 * 2;
    piVar8 = (int *)realloc(piVar8,(long)(int)(uVar5 * 2) << 2);
    uVar5 = (p->pClauses).iTail;
    (p->pClauses).pData = piVar8;
  }
  (p->pClauses).iTail = uVar5 + 1;
  piVar8[(int)uVar5] = 0;
  iVar9 = (p->pClauses).iTail;
  if (iVar9 == (p->pClauses).nSize) {
    (p->pClauses).nSize = iVar9 * 2;
    piVar8 = (int *)realloc(piVar8,(long)iVar9 << 3);
    iVar9 = (p->pClauses).iTail;
    (p->pClauses).pData = piVar8;
    piVar16 = piVar8;
  }
  else {
    piVar16 = (p->pClauses).pData;
  }
  (p->pClauses).iTail = iVar9 + 1;
  piVar8[iVar9] = 0;
  (p->pClauses).iHead = (p->pClauses).iTail;
  uVar5 = piVar16[lVar12 + 1];
  if (-1 < (int)uVar5) {
    uVar15 = (ulong)uVar5 ^ 1;
    if ((int)uVar15 < (p->vWatches).nSize) {
      piVar8 = (p->vWatches).pArray;
      if (piVar8[uVar15] == 0) {
        Vec_IntPush(&p->vWatchUpds,(int)uVar15);
        uVar17 = piVar16[lVar12 + 2];
        if ((piVar16[lVar12 + 1] != uVar5) && (uVar17 = uVar5, piVar16[lVar12 + 2] != uVar5))
        goto LAB_007230ef;
      }
      else {
        uVar17 = piVar16[lVar12 + 2];
      }
      piVar16 = (p->pClauses).pData;
      piVar16[(int)((uint)(uVar17 == uVar5) + uVar3 + 1 + piVar16[lVar12])] = piVar8[uVar15];
      piVar8[uVar15] = uVar3;
      uVar5 = piVar16[lVar12 + 2];
      if ((int)uVar5 < 0) goto LAB_007230b1;
      uVar15 = (ulong)uVar5 ^ 1;
      if ((int)uVar15 < (p->vWatches).nSize) {
        piVar8 = (p->vWatches).pArray;
        uVar17 = uVar5;
        if (piVar8[uVar15] == 0) {
          Vec_IntPush(&p->vWatchUpds,(int)uVar15);
          uVar17 = piVar16[lVar12 + 2];
        }
        uVar6 = uVar17;
        if ((piVar16[lVar12 + 1] == uVar5) || (uVar6 = uVar5, uVar17 == uVar5)) {
          piVar16 = (p->pClauses).pData;
          piVar16[(int)(uVar3 + 1 + (uint)(uVar6 == uVar5) + piVar16[lVar12])] = piVar8[uVar15];
          piVar8[uVar15] = uVar3;
          return uVar2;
        }
LAB_007230ef:
        __assert_fail("Lit == pLits[0] || Lit == pLits[1]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                      ,0x2a3,"void Cbs2_ManWatchClause(Cbs2_Man_t *, int, int)");
      }
    }
LAB_00722f5c:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
LAB_007230b1:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x131,"int Abc_LitNot(int)");
}

Assistant:

static inline int Cbs2_ManDeriveReason( Cbs2_Man_t * p, int Level )
{
    Cbs2_Que_t * pQue = &(p->pClauses);
    int i, k, iObj, iLitLevel, * pReason;
    assert( pQue->pData[pQue->iHead] == 0 );
    assert( pQue->pData[pQue->iHead+1] == 0 );
    assert( pQue->iHead + 2 < pQue->iTail );
    //for ( i = pQue->iHead + 2; i < pQue->iTail; i++ )
    //    assert( !Cbs2_VarMark0(p, pQue->pData[i]) );
    // compact literals
    Vec_IntClear( p->vTemp );
    for ( i = k = pQue->iHead + 2; i < pQue->iTail; i++ )
    {
        iObj = pQue->pData[i];
        if ( Cbs2_VarMark0(p, iObj) ) // unassigned - seen again
            continue;
        //if ( Vec_IntEntry(&p->vActivity, iObj) == 0 )
        //    Vec_IntPush( &p->vActStore, iObj );
        //Vec_IntAddToEntry( &p->vActivity, iObj, 1 );
        // assigned - seen first time
        Cbs2_VarSetMark0(p, iObj, 1);
        Vec_IntPush( p->vTemp, iObj );
        // check decision level
        iLitLevel = Cbs2_VarDecLevel( p, iObj );
        if ( iLitLevel < Level )
        {
            pQue->pData[k++] = iObj;
            continue;
        }
        assert( iLitLevel == Level );
        pReason = Cbs2_VarReasonP( p, iObj );
        if ( pReason[0] == 0 && pReason[1] == 0 ) // no reason
        {
            assert( pQue->pData[pQue->iHead+1] == 0 );
            pQue->pData[pQue->iHead+1] = iObj;
        }
        else if ( pReason[0] != 0 ) // circuit reason
        {
            Cbs2_QuePush( pQue, pReason[0] );
            if ( pReason[1] )
            Cbs2_QuePush( pQue, pReason[1] );
        }
        else // clause reason
        {
            int i, * pLits, nLits = Cbs2_ClauseSize( p, pReason[1] );
            assert( pReason[1] );
            Cbs2_QueGrow( pQue, nLits );
            pLits = Cbs2_ClauseLits( p, pReason[1] );
            assert( iObj == Abc_Lit2Var(pLits[0]) );
            for ( i = 1; i < nLits; i++ )
                Cbs2_QuePush( pQue, Abc_Lit2Var(pLits[i]) );
        }
    }
    assert( pQue->pData[pQue->iHead] == 0 );
    assert( pQue->pData[pQue->iHead+1] != 0 );
    pQue->iTail = k;
    // clear the marks
    Vec_IntForEachEntry( p->vTemp, iObj, i )
        Cbs2_VarSetMark0(p, iObj, 0);
    return Cbs2_QueFinish( p, Level );
}